

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_hdr_add_hrec(bcf_hdr_t *hdr,bcf_hrec_t *hrec)

{
  bcf_hrec_t *pbVar1;
  char *__s2;
  int iVar2;
  bcf_hrec_t **ppbVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar4 = 0;
  if (hrec != (bcf_hrec_t *)0x0) {
    hrec->type = 5;
    iVar2 = bcf_hdr_register_hrec(hdr,hrec);
    if (iVar2 == 0) {
      if (hrec->type != 5) {
        bcf_hrec_destroy(hrec);
        return 0;
      }
      uVar4 = hdr->nhrec;
      uVar5 = 0;
      uVar6 = 0;
      if (0 < (int)uVar4) {
        uVar6 = (ulong)uVar4;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        pbVar1 = hdr->hrec[uVar5];
        if (pbVar1->type == 5) {
          __s2 = hrec->key;
          iVar2 = strcmp(pbVar1->key,__s2);
          if ((iVar2 == 0) &&
             ((iVar2 = strcmp(__s2,"fileformat"), iVar2 == 0 ||
              (iVar2 = strcmp(pbVar1->value,hrec->value), iVar2 == 0)))) {
            bcf_hrec_destroy(hrec);
            return 0;
          }
        }
      }
    }
    else {
      uVar4 = hdr->nhrec;
    }
    hdr->nhrec = uVar4 + 1;
    ppbVar3 = (bcf_hrec_t **)realloc(hdr->hrec,(long)(int)uVar4 * 8 + 8);
    hdr->hrec = ppbVar3;
    ppbVar3[(int)uVar4] = hrec;
    hdr->dirty = 1;
    uVar4 = (uint)(hrec->type != 5);
  }
  return uVar4;
}

Assistant:

int bcf_hdr_add_hrec(bcf_hdr_t *hdr, bcf_hrec_t *hrec)
{
    if ( !hrec ) return 0;

    hrec->type = BCF_HL_GEN;
    if ( !bcf_hdr_register_hrec(hdr,hrec) )
    {
        // If one of the hashed field, then it is already present
        if ( hrec->type != BCF_HL_GEN )
        {
            bcf_hrec_destroy(hrec);
            return 0;
        }

        // Is one of the generic fields and already present?
        int i;
        for (i=0; i<hdr->nhrec; i++)
        {
            if ( hdr->hrec[i]->type!=BCF_HL_GEN ) continue;
            if ( !strcmp(hdr->hrec[i]->key,hrec->key) && !strcmp(hrec->key,"fileformat") ) break;
            if ( !strcmp(hdr->hrec[i]->key,hrec->key) && !strcmp(hdr->hrec[i]->value,hrec->value) ) break;
        }
        if ( i<hdr->nhrec )
        {
            bcf_hrec_destroy(hrec);
            return 0;
        }
    }

    // New record, needs to be added
    int n = ++hdr->nhrec;
    hdr->hrec = (bcf_hrec_t**) realloc(hdr->hrec, n*sizeof(bcf_hrec_t*));
    hdr->hrec[n-1] = hrec;
    hdr->dirty = 1;

    return hrec->type==BCF_HL_GEN ? 0 : 1;
}